

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void __thiscall lexer::Lexer::~Lexer(Lexer *this)

{
  std::_Destroy_aux<false>::
  __destroy<std::vector<lexer::Transition,std::allocator<lexer::Transition>>*>
            ((this->lexerStateMachine).
             super__Vector_base<std::vector<lexer::Transition,_std::allocator<lexer::Transition>_>,_std::allocator<std::vector<lexer::Transition,_std::allocator<lexer::Transition>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start,
             (this->lexerStateMachine).
             super__Vector_base<std::vector<lexer::Transition,_std::allocator<lexer::Transition>_>,_std::allocator<std::vector<lexer::Transition,_std::allocator<lexer::Transition>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  std::
  _Vector_base<std::vector<lexer::Transition,_std::allocator<lexer::Transition>_>,_std::allocator<std::vector<lexer::Transition,_std::allocator<lexer::Transition>_>_>_>
  ::~_Vector_base((_Vector_base<std::vector<lexer::Transition,_std::allocator<lexer::Transition>_>,_std::allocator<std::vector<lexer::Transition,_std::allocator<lexer::Transition>_>_>_>
                   *)this);
  return;
}

Assistant:

explicit Lexer(LexerRules const &lexerRules) {
            lexerStateMachine.resize(lexerRules.size());

            size_t maxChar = std::numeric_limits<uint8_t>::max();

            for_each_c (LexerRules, lexerRules, rule) {
                std::vector<Transition> lexerState;

                lexerState.resize(static_cast<size_t>(maxChar));

                for_each_c (LexerRule, rule->second, transition) {
                    if (transition->first.inSet)
                        for_each_c (std::string, transition->first.chars, c)
                            updateTransition(lexerState, transition->second, *c);
                    else
                        for (char c = 0; c < maxChar; ++c)
                            if (std::find(transition->first.chars.begin(),
                                          transition->first.chars.end(), c) == transition->first.chars.end())
                                updateTransition(lexerState, transition->second, c);
                }

                lexerStateMachine.at(static_cast<size_t>(rule->first)) = lexerState;
            }
        }